

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cdev.cpp
# Opt level: O0

bool __thiscall
I2Cdev::writeBitsW(I2Cdev *this,uint16_t regAddr,uint8_t bitStart,uint8_t length,uint16_t data)

{
  byte bVar1;
  int iVar2;
  ushort local_20;
  uint16_t local_1e;
  byte local_1c;
  uint8_t local_1b;
  uint16_t uStack_1a;
  uint8_t mask;
  uint16_t w;
  uint16_t data_local;
  uint8_t length_local;
  uint8_t bitStart_local;
  uint16_t regAddr_local;
  I2Cdev *this_local;
  
  local_1e = data;
  local_1c = length;
  local_1b = bitStart;
  uStack_1a = regAddr;
  _w = this;
  iVar2 = (*(this->super_I2Cgeneric)._vptr_I2Cgeneric[0x11])(this,(ulong)regAddr,&local_20,0);
  if ((char)iVar2 == '\0') {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = (byte)((1 << (local_1c & 0x1f)) + -1 << ((local_1b - local_1c) + 1 & 0x1f));
    local_1e = local_1e << ((local_1b - local_1c) + 1 & 0x1f) & (ushort)bVar1;
    local_20 = local_20 & (bVar1 ^ 0xffff) | local_1e;
    iVar2 = (*(this->super_I2Cgeneric)._vptr_I2Cgeneric[0x21])
                      (this,(ulong)uStack_1a,(ulong)local_20);
    this_local._7_1_ = (bool)((byte)iVar2 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool I2Cdev::writeBitsW(uint16_t regAddr, uint8_t bitStart, uint8_t length, uint16_t data) {
    //              010 value to write
    // fedcba9876543210 bit numbers
    //    xxx           args: bitStart=12, length=3
    // 0001110000000000 mask byte
    // 1010111110010110 original value (sample)
    // 1010001110010110 original & ~mask
    // 1010101110010110 masked | value
    uint16_t w;
    if (this->readWord(regAddr, &w) != 0) {
        uint8_t mask = ((1 << length) - 1) << (bitStart - length + 1);
        data <<= (bitStart - length + 1); // shift data into correct position
        data &= mask; // zero all non-important bits in data
        w &= ~(mask); // zero all important bits in existing word
        w |= data; // combine data with existing word
        return this->writeWord(regAddr, w);
    } else {
        return false;
    }
}